

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflechannel.cpp
# Opt level: O0

int __thiscall ncnn::ShuffleChannel::forward(ShuffleChannel *this,Mat *bottom_blob,Mat *top_blob)

{
  bool bVar1;
  void *__src;
  long in_RSI;
  long in_RDI;
  int dst_q;
  int src_q;
  int j;
  int i;
  size_t feature_sz;
  int chs_per_group;
  size_t elemsize;
  int c;
  int h;
  int w;
  Mat *in_stack_ffffffffffffff20;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  Mat *in_stack_ffffffffffffff40;
  Mat local_88;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  size_t local_48;
  int local_3c;
  long local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_4;
  
  local_24 = *(int *)(in_RSI + 0x1c);
  local_28 = *(int *)(in_RSI + 0x20);
  local_2c = *(int *)(in_RSI + 0x24);
  local_38 = *(long *)(in_RSI + 0x10);
  local_3c = local_2c / *(int *)(in_RDI + 0x80);
  if (local_2c == local_3c * *(int *)(in_RDI + 0x80)) {
    Mat::create(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                (int)((ulong)in_RDI >> 0x20),(size_t)in_stack_ffffffffffffff28);
    bVar1 = Mat::empty(in_stack_ffffffffffffff20);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_48 = (local_24 * local_28) * local_38;
      for (local_4c = 0; local_4c != *(int *)(in_RDI + 0x80); local_4c = local_4c + 1) {
        for (local_50 = 0; local_50 != local_3c; local_50 = local_50 + 1) {
          local_54 = local_3c * local_4c + local_50;
          local_58 = *(int *)(in_RDI + 0x80) * local_50 + local_4c;
          this_00 = &local_88;
          Mat::channel(in_stack_ffffffffffffff28,(int)((ulong)this_00 >> 0x20));
          in_stack_ffffffffffffff28 = (Mat *)Mat::operator_cast_to_void_(this_00);
          Mat::channel(in_stack_ffffffffffffff28,(int)((ulong)this_00 >> 0x20));
          __src = Mat::operator_cast_to_void_((Mat *)&stack0xffffffffffffff38);
          memcpy(in_stack_ffffffffffffff28,__src,local_48);
          Mat::~Mat((Mat *)0x14dd0a);
          Mat::~Mat((Mat *)0x14dd14);
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = -100;
  }
  return local_4;
}

Assistant:

int ShuffleChannel::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int c = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int chs_per_group = c / group;

    if (c != chs_per_group * group)
    {
        // reject invalid group
        return -100;
    }

    top_blob.create(w, h, c, elemsize);
    if (top_blob.empty())
        return -100;

    const size_t feature_sz = w * h * elemsize;
    for (int i = 0; i != group; i++)
    {
        for (int j = 0; j != chs_per_group; j++)
        {
            int src_q = chs_per_group * i + j;
            int dst_q = group * j + i;
            memcpy(top_blob.channel(dst_q), bottom_blob.channel(src_q), feature_sz);
        }
    }
    return 0;
}